

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ect.cc
# Opt level: O1

void ect_train(ect *e,single_learner *base,example *ec)

{
  uint64_t *puVar1;
  bool bVar2;
  direction *pdVar3;
  size_t sVar4;
  example *peVar5;
  single_learner *psVar6;
  uint64_t uVar7;
  uint32_t *puVar8;
  bool *pbVar9;
  undefined1 uVar10;
  ulong uVar11;
  bool *pbVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  byte bVar16;
  uint32_t uVar17;
  bool local_73;
  bool local_72;
  bool local_71;
  float local_70;
  float local_6c;
  v_array<bool> *local_68;
  ulong local_60;
  ect *local_58;
  ulong local_50;
  example *local_48;
  uint local_3c;
  single_learner *local_38;
  
  if (e->k != 1) {
    uVar17 = (ec->l).multi.label;
    local_68 = &e->tournaments_won;
    local_48 = ec;
    local_38 = base;
    v_array<bool>::clear(local_68);
    peVar5 = local_48;
    uVar13 = uVar17 - 1;
    pdVar3 = (e->directions)._begin;
    uVar11 = (ulong)pdVar3[uVar13].winner;
    bVar16 = pdVar3[uVar11].left == uVar13;
    local_58 = e;
    do {
      psVar6 = local_38;
      local_6c = -1.0;
      local_60 = CONCAT71(local_60._1_7_,bVar16);
      if ((bVar16 & 1) == 0) {
        local_6c = 1.0;
      }
      (peVar5->l).simple.label = local_6c;
      (peVar5->l).simple.initial = 0.0;
      uVar17 = (uint32_t)uVar11;
      iVar14 = uVar17 - (int)e->k;
      puVar1 = &(peVar5->super_example_predict).ft_offset;
      *puVar1 = *puVar1 + (ulong)(uint)(*(int *)(local_38 + 0xe0) * iVar14);
      (**(code **)(local_38 + 0x28))
                (*(undefined8 *)(local_38 + 0x18),*(undefined8 *)(local_38 + 0x20),peVar5);
      uVar7 = (peVar5->super_example_predict).ft_offset -
              (ulong)(uint)(iVar14 * *(int *)(psVar6 + 0xe0));
      (peVar5->super_example_predict).ft_offset = uVar7;
      local_70 = peVar5->weight;
      peVar5->weight = 0.0;
      iVar14 = uVar17 - (int)local_58->k;
      (peVar5->super_example_predict).ft_offset = (uint)(*(int *)(psVar6 + 0xe0) * iVar14) + uVar7;
      (**(code **)(psVar6 + 0x28))
                (*(undefined8 *)(psVar6 + 0x18),*(undefined8 *)(psVar6 + 0x20),peVar5);
      e = local_58;
      puVar1 = &(peVar5->super_example_predict).ft_offset;
      *puVar1 = *puVar1 - (ulong)(uint)(iVar14 * *(int *)(psVar6 + 0xe0));
      peVar5->weight = local_70;
      pdVar3 = (local_58->directions)._begin;
      if (((peVar5->pred).scalar - local_58->class_boundary) * local_6c <= 0.0) {
        if (pdVar3[uVar11].last == false) {
          bVar16 = pdVar3[pdVar3[uVar11].loser].left == uVar17;
          if ((ulong)pdVar3[uVar11].loser == 0) {
            local_72 = false;
            v_array<bool>::push_back(local_68,&local_72);
          }
        }
        else {
          local_73 = false;
          v_array<bool>::push_back(local_68,&local_73);
          bVar16 = (byte)local_60;
        }
        puVar8 = &(e->directions)._begin[uVar11].loser;
      }
      else {
        if (pdVar3[uVar11].last == false) {
          bVar16 = pdVar3[pdVar3[uVar11].winner].left == uVar17;
        }
        else {
          local_71 = true;
          v_array<bool>::push_back(local_68,&local_71);
          bVar16 = (byte)local_60;
        }
        puVar8 = &(e->directions)._begin[uVar11].winner;
      }
      uVar11 = (ulong)*puVar8;
    } while (*puVar8 != 0);
    if ((e->tournaments_won)._end == (e->tournaments_won)._begin) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"badness!",8);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
      std::ostream::put(-0x18);
      std::ostream::flush();
    }
    psVar6 = local_38;
    peVar5 = local_48;
    if (e->tree_height != 0) {
      local_50 = 0;
      do {
        pbVar9 = (e->tournaments_won)._begin;
        if (1 < (ulong)((long)(e->tournaments_won)._end - (long)pbVar9)) {
          local_60 = ~local_50;
          local_68 = (v_array<bool> *)CONCAT44(local_68._4_4_,(int)local_50 + 1);
          local_3c = ~(-1 << ((byte)local_50 & 0x1f));
          uVar13 = 1;
          uVar15 = 1;
          uVar11 = 0;
          do {
            bVar2 = pbVar9[uVar13 - 1];
            if (bVar2 == pbVar9[uVar13]) {
              pbVar9[uVar11] = bVar2;
            }
            else {
              local_70 = (float)CONCAT31(local_70._1_3_,pbVar9[uVar13]);
              uVar17 = 0xbf800000;
              local_6c = (float)CONCAT31(local_6c._1_3_,bVar2);
              if (bVar2 == false) {
                uVar17 = 0x3f800000;
              }
              sVar4 = e->tree_height;
              (peVar5->l).multi.label = uVar17;
              (peVar5->l).simple.weight = (float)(1 << ((char)(int)sVar4 + (char)local_60 & 0x1fU));
              (peVar5->l).simple.initial = 0.0;
              iVar14 = (uVar15 - 1 << ((byte)local_68 & 0x1f)) + local_3c + local_58->last_pair;
              puVar1 = &(peVar5->super_example_predict).ft_offset;
              *puVar1 = *puVar1 + (ulong)(uint)(*(int *)(psVar6 + 0xe0) * iVar14);
              (**(code **)(psVar6 + 0x28))
                        (*(undefined8 *)(psVar6 + 0x18),*(undefined8 *)(psVar6 + 0x20),peVar5);
              puVar1 = &(peVar5->super_example_predict).ft_offset;
              *puVar1 = *puVar1 - (ulong)(uint)(iVar14 * *(int *)(psVar6 + 0xe0));
              if ((peVar5->pred).scalar < local_58->class_boundary ||
                  (peVar5->pred).scalar == local_58->class_boundary) {
                uVar10 = local_6c._0_1_;
              }
              else {
                uVar10 = local_70._0_1_;
              }
              (local_58->tournaments_won)._begin[uVar11] = (bool)uVar10;
              e = local_58;
            }
            pbVar9 = (e->tournaments_won)._begin;
            uVar11 = (long)(e->tournaments_won)._end - (long)pbVar9;
            if ((uVar11 & 1) != 0) {
              pbVar9[uVar11 >> 1] = pbVar9[uVar11 - 1];
            }
            pbVar9 = (e->tournaments_won)._begin;
            pbVar12 = (e->tournaments_won)._end + (1 - (long)pbVar9);
            (e->tournaments_won)._end = pbVar9 + ((ulong)pbVar12 >> 1);
            uVar11 = (ulong)uVar15;
            uVar15 = uVar15 + 1;
            uVar13 = uVar13 + 2;
          } while (uVar11 < (ulong)pbVar12 >> 2);
        }
        local_50 = local_50 + 1;
      } while (local_50 < e->tree_height);
    }
  }
  return;
}

Assistant:

void ect_train(ect& e, single_learner& base, example& ec)
{
  if (e.k == 1)  // nothing to do
    return;
  MULTICLASS::label_t mc = ec.l.multi;

  label_data simple_temp;

  simple_temp.initial = 0.;

  e.tournaments_won.clear();

  uint32_t id = e.directions[mc.label - 1].winner;
  bool left = e.directions[id].left == mc.label - 1;
  do
  {
    if (left)
      simple_temp.label = -1;
    else
      simple_temp.label = 1;

    ec.l.simple = simple_temp;
    base.learn(ec, id - e.k);
    float old_weight = ec.weight;
    ec.weight = 0.;
    base.learn(ec, id - e.k);  // inefficient, we should extract final prediction exactly.
    ec.weight = old_weight;

    bool won = (ec.pred.scalar - e.class_boundary) * simple_temp.label > 0;

    if (won)
    {
      if (!e.directions[id].last)
        left = e.directions[e.directions[id].winner].left == id;
      else
        e.tournaments_won.push_back(true);
      id = e.directions[id].winner;
    }
    else
    {
      if (!e.directions[id].last)
      {
        left = e.directions[e.directions[id].loser].left == id;
        if (e.directions[id].loser == 0)
          e.tournaments_won.push_back(false);
      }
      else
        e.tournaments_won.push_back(false);
      id = e.directions[id].loser;
    }
  } while (id != 0);

  if (e.tournaments_won.size() < 1)
    cout << "badness!" << endl;

  // tournaments_won is a bit vector determining which tournaments the label won.
  for (size_t i = 0; i < e.tree_height; i++)
  {
    for (uint32_t j = 0; j < e.tournaments_won.size() / 2; j++)
    {
      bool left = e.tournaments_won[j * 2];
      bool right = e.tournaments_won[j * 2 + 1];
      if (left == right)  // no query to do
        e.tournaments_won[j] = left;
      else  // query to do
      {
        if (left)
          simple_temp.label = -1;
        else
          simple_temp.label = 1;
        simple_temp.weight = (float)(1 << (e.tree_height - i - 1));
        ec.l.simple = simple_temp;

        uint32_t problem_number = e.last_pair + j * (1 << (i + 1)) + (1 << i) - 1;

        base.learn(ec, problem_number);

        if (ec.pred.scalar > e.class_boundary)
          e.tournaments_won[j] = right;
        else
          e.tournaments_won[j] = left;
      }
      if (e.tournaments_won.size() % 2 == 1)
        e.tournaments_won[e.tournaments_won.size() / 2] = e.tournaments_won[e.tournaments_won.size() - 1];
      e.tournaments_won.end() = e.tournaments_won.begin() + (1 + e.tournaments_won.size()) / 2;
    }
  }
}